

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O0

uint8 * __thiscall
bloaty::Options::InternalSerializeWithCachedSizesToArray
          (Options *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  pointer pUVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint32 uVar6;
  uint uVar7;
  size_t sVar8;
  void *pvVar9;
  uint64 uVar10;
  uint8 *puVar11;
  EpsCopyOutputStream *pEVar12;
  UnknownFieldSet *in_RDX;
  _Alloc_hider *in_RSI;
  Options *in_RDI;
  string *s_4;
  int n_5;
  int i_5;
  string *s_3;
  int n_4;
  int i_4;
  uint n_3;
  uint i_3;
  string *s_2;
  int n_2;
  int i_2;
  string *s_1;
  int n_1;
  int i_1;
  string *s;
  int n;
  int i;
  uint32 cached_has_bits;
  ptrdiff_t size_4;
  ptrdiff_t size_3;
  ptrdiff_t size_2;
  ptrdiff_t size_1;
  ptrdiff_t size;
  Operation in_stack_fffffffffffffac8;
  int in_stack_fffffffffffffacc;
  Options *in_stack_fffffffffffffad0;
  string *in_stack_fffffffffffffad8;
  long in_stack_fffffffffffffae0;
  EpsCopyOutputStream *in_stack_fffffffffffffae8;
  string *in_stack_fffffffffffffaf0;
  UnknownFieldSet *pUVar13;
  uint32 in_stack_fffffffffffffafc;
  EpsCopyOutputStream *in_stack_fffffffffffffb00;
  uint8 *in_stack_fffffffffffffb08;
  CustomDataSource *in_stack_fffffffffffffb10;
  _Alloc_hider *__dest;
  EpsCopyOutputStream *in_stack_fffffffffffffb18;
  uint8 *in_stack_fffffffffffffb20;
  UnknownFieldSet *in_stack_fffffffffffffb28;
  int local_42c;
  int local_41c;
  uint local_414;
  int local_404;
  int local_3f4;
  int local_3e0;
  _Alloc_hider *local_3d0;
  _Alloc_hider *local_398;
  _Alloc_hider *local_368;
  _Alloc_hider *local_338;
  _Alloc_hider *local_308;
  _Alloc_hider *local_2d8;
  
  local_3e0 = 0;
  iVar4 = _internal_filename_size((Options *)0x1a2b0a);
  local_3d0 = in_RSI;
  for (; local_3e0 < iVar4; local_3e0 = local_3e0 + 1) {
    _internal_filename_abi_cxx11_(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
    std::__cxx11::string::data();
    std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,in_stack_fffffffffffffac8
               ,(char *)0x1a2b7e);
    sVar8 = std::__cxx11::string::size();
    bVar3 = true;
    if ((long)sVar8 < 0x80) {
      pUVar2 = (in_RDX->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar5 = google::protobuf::io::EpsCopyOutputStream::TagSize(8);
      bVar3 = (long)pUVar2 + (-(long)iVar5 - (long)local_3d0) + 0xf < (long)sVar8;
    }
    if (bVar3) {
      local_2d8 = (_Alloc_hider *)
                  google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
                            (in_stack_fffffffffffffae8,
                             (uint32)((ulong)in_stack_fffffffffffffae0 >> 0x20),
                             in_stack_fffffffffffffad8,(uint8 *)in_stack_fffffffffffffad0);
    }
    else {
      *local_3d0 = (_Alloc_hider)0xa;
      local_3d0[1] = SUB81(sVar8,0);
      pvVar9 = (void *)std::__cxx11::string::data();
      memcpy(local_3d0 + 2,pvVar9,sVar8);
      local_2d8 = local_3d0 + 2 + sVar8;
    }
    local_3d0 = local_2d8;
  }
  local_3f4 = 0;
  iVar4 = _internal_base_filename_size((Options *)0x1a2e98);
  for (; local_3f4 < iVar4; local_3f4 = local_3f4 + 1) {
    _internal_base_filename_abi_cxx11_(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
    std::__cxx11::string::data();
    std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,in_stack_fffffffffffffac8
               ,(char *)0x1a2f0c);
    sVar8 = std::__cxx11::string::size();
    bVar3 = true;
    if ((long)sVar8 < 0x80) {
      pUVar2 = (in_RDX->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar5 = google::protobuf::io::EpsCopyOutputStream::TagSize(0x10);
      bVar3 = (long)pUVar2 + (-(long)iVar5 - (long)local_3d0) + 0xf < (long)sVar8;
    }
    if (bVar3) {
      local_308 = (_Alloc_hider *)
                  google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
                            (in_stack_fffffffffffffae8,
                             (uint32)((ulong)in_stack_fffffffffffffae0 >> 0x20),
                             in_stack_fffffffffffffad8,(uint8 *)in_stack_fffffffffffffad0);
    }
    else {
      *local_3d0 = (_Alloc_hider)0x12;
      local_3d0[1] = SUB81(sVar8,0);
      pvVar9 = (void *)std::__cxx11::string::data();
      memcpy(local_3d0 + 2,pvVar9,sVar8);
      local_308 = local_3d0 + 2 + sVar8;
    }
    local_3d0 = local_308;
  }
  local_404 = 0;
  iVar4 = _internal_data_source_size((Options *)0x1a3226);
  for (; local_404 < iVar4; local_404 = local_404 + 1) {
    _internal_data_source_abi_cxx11_(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
    std::__cxx11::string::data();
    std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,in_stack_fffffffffffffac8
               ,(char *)0x1a329a);
    sVar8 = std::__cxx11::string::size();
    bVar3 = true;
    if ((long)sVar8 < 0x80) {
      pUVar2 = (in_RDX->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar5 = google::protobuf::io::EpsCopyOutputStream::TagSize(0x18);
      bVar3 = (long)pUVar2 + (-(long)iVar5 - (long)local_3d0) + 0xf < (long)sVar8;
    }
    if (bVar3) {
      local_338 = (_Alloc_hider *)
                  google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
                            (in_stack_fffffffffffffae8,
                             (uint32)((ulong)in_stack_fffffffffffffae0 >> 0x20),
                             in_stack_fffffffffffffad8,(uint8 *)in_stack_fffffffffffffad0);
    }
    else {
      *local_3d0 = (_Alloc_hider)0x1a;
      local_3d0[1] = SUB81(sVar8,0);
      pvVar9 = (void *)std::__cxx11::string::data();
      memcpy(local_3d0 + 2,pvVar9,sVar8);
      local_338 = local_3d0 + 2 + sVar8;
    }
    local_3d0 = local_338;
  }
  uVar1 = (in_RDI->_has_bits_).has_bits_[0];
  if ((uVar1 & 0x100) != 0) {
    google::protobuf::io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffad0,
               (uint8 **)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
    uVar10 = _internal_max_rows_per_level(in_RDI);
    uVar6 = google::protobuf::internal::WireFormatLite::MakeTag(4,WIRETYPE_VARINT);
    puVar11 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray
                        (uVar6,(uint8 *)local_3d0);
    local_3d0 = (_Alloc_hider *)
                google::protobuf::io::CodedOutputStream::WriteVarint64ToArray(uVar10,puVar11);
  }
  if ((uVar1 & 4) != 0) {
    google::protobuf::io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffad0,
               (uint8 **)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
    _internal_demangle(in_RDI);
    uVar6 = google::protobuf::internal::WireFormatLite::MakeTag(5,WIRETYPE_VARINT);
    google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar6,(uint8 *)local_3d0);
    local_3d0 = (_Alloc_hider *)
                google::protobuf::io::CodedOutputStream::WriteVarint32SignExtendedToArray
                          ((int32)((ulong)in_stack_fffffffffffffad0 >> 0x20),
                           (uint8 *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
  }
  if ((uVar1 & 8) != 0) {
    google::protobuf::io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffad0,
               (uint8 **)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
    _internal_sort_by(in_RDI);
    uVar6 = google::protobuf::internal::WireFormatLite::MakeTag(6,WIRETYPE_VARINT);
    google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar6,(uint8 *)local_3d0);
    local_3d0 = (_Alloc_hider *)
                google::protobuf::io::CodedOutputStream::WriteVarint32SignExtendedToArray
                          ((int32)((ulong)in_stack_fffffffffffffad0 >> 0x20),
                           (uint8 *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
  }
  if ((uVar1 & 0x10) != 0) {
    google::protobuf::io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffad0,
               (uint8 **)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
    _internal_verbose_level(in_RDI);
    uVar6 = google::protobuf::internal::WireFormatLite::MakeTag(7,WIRETYPE_VARINT);
    google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar6,(uint8 *)local_3d0);
    local_3d0 = (_Alloc_hider *)
                google::protobuf::io::CodedOutputStream::WriteVarint32SignExtendedToArray
                          ((int32)((ulong)in_stack_fffffffffffffad0 >> 0x20),
                           (uint8 *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
  }
  local_414 = 0;
  uVar7 = _internal_custom_data_source_size((Options *)0x1a3a04);
  for (; local_414 < uVar7; local_414 = local_414 + 1) {
    google::protobuf::io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffad0,
               (uint8 **)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
    _internal_custom_data_source(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
    uVar6 = google::protobuf::internal::WireFormatLite::MakeTag(8,WIRETYPE_LENGTH_DELIMITED);
    puVar11 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray
                        (uVar6,(uint8 *)local_3d0);
    uVar6 = CustomDataSource::GetCachedSize((CustomDataSource *)0x1a3afc);
    google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar6,puVar11);
    local_3d0 = (_Alloc_hider *)
                CustomDataSource::InternalSerializeWithCachedSizesToArray
                          (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
                           in_stack_fffffffffffffb00);
  }
  if ((uVar1 & 1) != 0) {
    _internal_disassemble_function_abi_cxx11_((Options *)0x1a3b6e);
    std::__cxx11::string::data();
    _internal_disassemble_function_abi_cxx11_((Options *)0x1a3b88);
    std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,in_stack_fffffffffffffac8
               ,(char *)0x1a3ba8);
    _internal_disassemble_function_abi_cxx11_((Options *)0x1a3bc2);
    local_3d0 = (_Alloc_hider *)
                google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                          (in_stack_fffffffffffffb00,in_stack_fffffffffffffafc,
                           in_stack_fffffffffffffaf0,(uint8 *)in_stack_fffffffffffffae8);
  }
  local_41c = 0;
  iVar4 = _internal_debug_filename_size((Options *)0x1a3bfc);
  for (; local_41c < iVar4; local_41c = local_41c + 1) {
    _internal_debug_filename_abi_cxx11_(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
    in_stack_fffffffffffffb20 = (uint8 *)std::__cxx11::string::data();
    std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,in_stack_fffffffffffffac8
               ,(char *)0x1a3c6a);
    in_stack_fffffffffffffb28 = in_RDX;
    sVar8 = std::__cxx11::string::size();
    bVar3 = true;
    if ((long)sVar8 < 0x80) {
      in_stack_fffffffffffffb18 =
           (EpsCopyOutputStream *)
           ((long)(in_stack_fffffffffffffb28->fields_).
                  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  ._M_impl.super__Vector_impl_data._M_start + (0x10 - (long)local_3d0));
      iVar5 = google::protobuf::io::EpsCopyOutputStream::TagSize(0x50);
      bVar3 = (long)in_stack_fffffffffffffb18 + (-1 - (long)iVar5) < (long)sVar8;
    }
    if (bVar3) {
      local_368 = (_Alloc_hider *)
                  google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
                            (in_stack_fffffffffffffae8,
                             (uint32)((ulong)in_stack_fffffffffffffae0 >> 0x20),
                             in_stack_fffffffffffffad8,(uint8 *)in_stack_fffffffffffffad0);
    }
    else {
      *local_3d0 = (_Alloc_hider)0x52;
      local_3d0[1] = SUB81(sVar8,0);
      __dest = local_3d0 + 2;
      pvVar9 = (void *)std::__cxx11::string::data();
      memcpy(__dest,pvVar9,sVar8);
      local_368 = local_3d0 + 2 + sVar8;
    }
    local_3d0 = local_368;
  }
  if ((uVar1 & 0x40) != 0) {
    google::protobuf::io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffad0,
               (uint8 **)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
    uVar10 = _internal_debug_vmaddr(in_RDI);
    uVar6 = google::protobuf::internal::WireFormatLite::MakeTag(0xb,WIRETYPE_VARINT);
    puVar11 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray
                        (uVar6,(uint8 *)local_3d0);
    local_3d0 = (_Alloc_hider *)
                google::protobuf::io::CodedOutputStream::WriteVarint64ToArray(uVar10,puVar11);
  }
  if ((uVar1 & 0x80) != 0) {
    google::protobuf::io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffad0,
               (uint8 **)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
    uVar10 = _internal_debug_fileoff(in_RDI);
    uVar6 = google::protobuf::internal::WireFormatLite::MakeTag(0xc,WIRETYPE_VARINT);
    puVar11 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray
                        (uVar6,(uint8 *)local_3d0);
    local_3d0 = (_Alloc_hider *)
                google::protobuf::io::CodedOutputStream::WriteVarint64ToArray(uVar10,puVar11);
  }
  if ((uVar1 & 2) != 0) {
    _internal_source_filter_abi_cxx11_((Options *)0x1a4182);
    pEVar12 = (EpsCopyOutputStream *)std::__cxx11::string::data();
    _internal_source_filter_abi_cxx11_((Options *)0x1a419c);
    std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,in_stack_fffffffffffffac8
               ,(char *)0x1a41bc);
    _internal_source_filter_abi_cxx11_((Options *)0x1a41d6);
    local_3d0 = (_Alloc_hider *)
                google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                          (pEVar12,in_stack_fffffffffffffafc,in_stack_fffffffffffffaf0,
                           (uint8 *)in_stack_fffffffffffffae8);
  }
  if ((uVar1 & 0x20) != 0) {
    google::protobuf::io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffad0,
               (uint8 **)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
    bVar3 = _internal_dump_raw_map(in_RDI);
    uVar6 = google::protobuf::internal::WireFormatLite::MakeTag(0xe,WIRETYPE_VARINT);
    puVar11 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray
                        (uVar6,(uint8 *)local_3d0);
    local_3d0 = (_Alloc_hider *)
                google::protobuf::io::CodedOutputStream::WriteVarint32ToArray((uint)bVar3,puVar11);
  }
  local_42c = 0;
  iVar4 = _internal_source_map_size((Options *)0x1a4327);
  for (; local_42c < iVar4; local_42c = local_42c + 1) {
    _internal_source_map_abi_cxx11_(in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
    pEVar12 = (EpsCopyOutputStream *)std::__cxx11::string::data();
    std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,in_stack_fffffffffffffac8
               ,(char *)0x1a4395);
    pUVar13 = in_RDX;
    sVar8 = std::__cxx11::string::size();
    bVar3 = true;
    if ((long)sVar8 < 0x80) {
      in_stack_fffffffffffffae0 =
           (long)(pUVar13->fields_).
                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 ._M_impl.super__Vector_impl_data._M_start + (0x10 - (long)local_3d0);
      iVar5 = google::protobuf::io::EpsCopyOutputStream::TagSize(0x78);
      bVar3 = (in_stack_fffffffffffffae0 - iVar5) + -1 < (long)sVar8;
    }
    if (bVar3) {
      local_398 = (_Alloc_hider *)
                  google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
                            (pEVar12,(uint32)((ulong)in_stack_fffffffffffffae0 >> 0x20),
                             in_stack_fffffffffffffad8,(uint8 *)in_stack_fffffffffffffad0);
    }
    else {
      *local_3d0 = (_Alloc_hider)0x7a;
      local_3d0[1] = SUB81(sVar8,0);
      in_stack_fffffffffffffad8 = (string *)(local_3d0 + 2);
      pvVar9 = (void *)std::__cxx11::string::data();
      memcpy(in_stack_fffffffffffffad8,pvVar9,sVar8);
      local_398 = &((string *)(local_3d0 + 2))->_M_dataplus + sVar8;
    }
    local_3d0 = local_398;
  }
  if (((uint)(in_RDI->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    if (((uint)(in_RDI->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_ & 1) == 1) {
      google::protobuf::internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)&in_RDI->_internal_metadata_);
    }
    else {
      google::protobuf::internal::InternalMetadataWithArena::default_instance();
    }
    local_3d0 = (_Alloc_hider *)
                google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                          (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
                           in_stack_fffffffffffffb18);
  }
  return (uint8 *)local_3d0;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* Options::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:bloaty.Options)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated string filename = 1;
  for (int i = 0, n = this->_internal_filename_size(); i < n; i++) {
    const auto& s = this->_internal_filename(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "bloaty.Options.filename");
    target = stream->WriteString(1, s, target);
  }

  // repeated string base_filename = 2;
  for (int i = 0, n = this->_internal_base_filename_size(); i < n; i++) {
    const auto& s = this->_internal_base_filename(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "bloaty.Options.base_filename");
    target = stream->WriteString(2, s, target);
  }

  // repeated string data_source = 3;
  for (int i = 0, n = this->_internal_data_source_size(); i < n; i++) {
    const auto& s = this->_internal_data_source(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "bloaty.Options.data_source");
    target = stream->WriteString(3, s, target);
  }

  cached_has_bits = _has_bits_[0];
  // optional int64 max_rows_per_level = 4 [default = 20];
  if (cached_has_bits & 0x00000100u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt64ToArray(4, this->_internal_max_rows_per_level(), target);
  }

  // optional .bloaty.Options.Demangle demangle = 5 [default = DEMANGLE_SHORT];
  if (cached_has_bits & 0x00000004u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      5, this->_internal_demangle(), target);
  }

  // optional .bloaty.Options.SortBy sort_by = 6 [default = SORTBY_BOTH];
  if (cached_has_bits & 0x00000008u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      6, this->_internal_sort_by(), target);
  }

  // optional int32 verbose_level = 7;
  if (cached_has_bits & 0x00000010u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(7, this->_internal_verbose_level(), target);
  }

  // repeated .bloaty.CustomDataSource custom_data_source = 8;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_custom_data_source_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(8, this->_internal_custom_data_source(i), target, stream);
  }

  // optional string disassemble_function = 9;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_disassemble_function().data(), static_cast<int>(this->_internal_disassemble_function().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "bloaty.Options.disassemble_function");
    target = stream->WriteStringMaybeAliased(
        9, this->_internal_disassemble_function(), target);
  }

  // repeated string debug_filename = 10;
  for (int i = 0, n = this->_internal_debug_filename_size(); i < n; i++) {
    const auto& s = this->_internal_debug_filename(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "bloaty.Options.debug_filename");
    target = stream->WriteString(10, s, target);
  }

  // optional uint64 debug_vmaddr = 11;
  if (cached_has_bits & 0x00000040u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(11, this->_internal_debug_vmaddr(), target);
  }

  // optional uint64 debug_fileoff = 12;
  if (cached_has_bits & 0x00000080u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(12, this->_internal_debug_fileoff(), target);
  }

  // optional string source_filter = 13;
  if (cached_has_bits & 0x00000002u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_source_filter().data(), static_cast<int>(this->_internal_source_filter().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "bloaty.Options.source_filter");
    target = stream->WriteStringMaybeAliased(
        13, this->_internal_source_filter(), target);
  }

  // optional bool dump_raw_map = 14;
  if (cached_has_bits & 0x00000020u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(14, this->_internal_dump_raw_map(), target);
  }

  // repeated string source_map = 15;
  for (int i = 0, n = this->_internal_source_map_size(); i < n; i++) {
    const auto& s = this->_internal_source_map(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "bloaty.Options.source_map");
    target = stream->WriteString(15, s, target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:bloaty.Options)
  return target;
}